

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_wrapper_t(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint32_t uVar1;
  
  uVar1 = verify_miniscript_and_v_property(node->type_properties,0x35101);
  node->type_properties = uVar1;
  return (uint)((uVar1 & 0xf) != 0) * 2 + -2;
}

Assistant:

static int verify_miniscript_wrapper_t(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    node->type_properties = verify_miniscript_and_v_property(
        node->type_properties, MINISCRIPT_PROPERTY_OP_1);
    if (!(node->type_properties & MINISCRIPT_TYPE_MASK))
        return WALLY_EINVAL;
    /* prop >= MINISCRIPT_PROPERTY_F */
    return WALLY_OK;
}